

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexSubImage2DArrayDepthCase::createTexture
          (TexSubImage2DArrayDepthCase *this)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int height;
  int depth;
  int zoffset;
  TransferFormat TVar5;
  char *str;
  void *pvVar6;
  PixelBufferAccess local_1a0;
  PixelBufferAccess local_178;
  int local_150;
  undefined1 local_14c [4];
  int cellSize;
  Vec4 colorB;
  Vec4 colorA;
  int z;
  int y;
  int x;
  int d;
  int h;
  int w;
  int levelH_1;
  int levelW_1;
  int ndx_1;
  PixelBufferAccess local_e0;
  undefined1 local_b8 [8];
  Vec4 gMax;
  Vec4 gMin;
  int levelH;
  int levelW;
  int ndx;
  TextureFormat local_80;
  undefined1 local_78 [8];
  TextureLevel levelData;
  undefined1 local_48 [4];
  deUint32 tex;
  Random rnd;
  deUint32 local_30;
  deUint32 dStack_2c;
  TransferFormat fmt;
  TexSubImage2DArrayDepthCase *this_local;
  
  rnd.m_rnd._8_8_ = (this->super_Texture2DArraySpecCase).m_texFormat;
  TVar5 = glu::getTransferFormat((TextureFormat)rnd.m_rnd._8_8_);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar1 = deStringHash(str);
  de::Random::Random((Random *)local_48,dVar1);
  levelData.m_data.m_cap._4_4_ = 0;
  local_30 = TVar5.format;
  dStack_2c = TVar5.dataType;
  local_80 = glu::mapGLTransferFormat(local_30,dStack_2c);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_78,&local_80);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)((long)&levelData.m_data.m_cap + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,0x8c1a
             ,levelData.m_data.m_cap._4_4_);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,
             1);
  dVar1 = sglr::ContextWrapper::glGetError
                    (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.
                      super_ContextWrapper);
  glu::checkError(dVar1,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSpecificationTests.cpp"
                  ,0xc83);
  for (levelH = 0; levelH < (this->super_Texture2DArraySpecCase).m_numLevels; levelH = levelH + 1) {
    iVar2 = de::max<int>(1,(this->super_Texture2DArraySpecCase).m_width >> ((byte)levelH & 0x1f));
    iVar3 = de::max<int>(1,(this->super_Texture2DArraySpecCase).m_height >> ((byte)levelH & 0x1f));
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),-1.5,-2.0,1.7,-1.5);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_b8,2.0,1.5,-1.0,2.0);
    tcu::TextureLevel::setSize
              ((TextureLevel *)local_78,iVar2,iVar3,(this->super_Texture2DArraySpecCase).m_numLayers
              );
    tcu::TextureLevel::getAccess(&local_e0,(TextureLevel *)local_78);
    tcu::fillWithComponentGradients(&local_e0,(Vec4 *)(gMax.m_data + 2),(Vec4 *)local_b8);
    iVar4 = (this->super_Texture2DArraySpecCase).m_numLayers;
    dVar1 = this->m_internalFormat;
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&levelW_1,(TextureLevel *)local_78);
    pvVar6 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&levelW_1);
    sglr::ContextWrapper::glTexImage3D
              (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
               0x8c1a,levelH,dVar1,iVar2,iVar3,iVar4,0,local_30,dStack_2c,pvVar6);
  }
  for (levelH_1 = 0; levelH_1 < (this->super_Texture2DArraySpecCase).m_numLevels;
      levelH_1 = levelH_1 + 1) {
    iVar4 = de::max<int>(1,(this->super_Texture2DArraySpecCase).m_width >> ((byte)levelH_1 & 0x1f));
    iVar2 = de::max<int>(1,(this->super_Texture2DArraySpecCase).m_height >> ((byte)levelH_1 & 0x1f))
    ;
    iVar3 = de::Random::getInt((Random *)local_48,1,iVar4);
    height = de::Random::getInt((Random *)local_48,1,iVar2);
    depth = de::Random::getInt((Random *)local_48,1,(this->super_Texture2DArraySpecCase).m_numLayers
                              );
    iVar4 = de::Random::getInt((Random *)local_48,0,iVar4 - iVar3);
    iVar2 = de::Random::getInt((Random *)local_48,0,iVar2 - height);
    zoffset = de::Random::getInt((Random *)local_48,0,
                                 (this->super_Texture2DArraySpecCase).m_numLayers - depth);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB.m_data + 2),2.0,1.5,-1.0,2.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_14c,-1.5,-2.0,1.7,-1.5);
    local_150 = de::Random::getInt((Random *)local_48,2,0x10);
    tcu::TextureLevel::setSize((TextureLevel *)local_78,iVar3,height,depth);
    tcu::TextureLevel::getAccess(&local_178,(TextureLevel *)local_78);
    tcu::fillWithGrid(&local_178,local_150,(Vec4 *)(colorB.m_data + 2),(Vec4 *)local_14c);
    tcu::TextureLevel::getAccess(&local_1a0,(TextureLevel *)local_78);
    pvVar6 = tcu::PixelBufferAccess::getDataPtr(&local_1a0);
    sglr::ContextWrapper::glTexSubImage3D
              (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
               0x8c1a,levelH_1,iVar4,iVar2,zoffset,iVar3,height,depth,local_30,dStack_2c,pvVar6);
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_78);
  de::Random::~Random((Random *)local_48);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat	fmt			= glu::getTransferFormat(m_texFormat);
		de::Random			rnd			(deStringHash(getName()));
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(fmt.format, fmt.dataType));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D_ARRAY, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
		GLU_CHECK();

		// First specify full texture.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int   levelW		= de::max(1, m_width >> ndx);
			const int   levelH		= de::max(1, m_height >> ndx);
			const Vec4  gMin		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const Vec4  gMax		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);

			levelData.setSize(levelW, levelH, m_numLayers);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage3D(GL_TEXTURE_2D_ARRAY, ndx, m_internalFormat, levelW, levelH, m_numLayers, 0, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}

		// Re-specify parts of each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int	levelW		= de::max(1, m_width >> ndx);
			const int	levelH		= de::max(1, m_height >> ndx);

			const int	w			= rnd.getInt(1, levelW);
			const int	h			= rnd.getInt(1, levelH);
			const int	d			= rnd.getInt(1, m_numLayers);
			const int	x			= rnd.getInt(0, levelW-w);
			const int	y			= rnd.getInt(0, levelH-h);
			const int	z			= rnd.getInt(0, m_numLayers-d);

			const Vec4	colorA		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);
			const Vec4	colorB		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const int	cellSize	= rnd.getInt(2, 16);

			levelData.setSize(w, h, d);
			tcu::fillWithGrid(levelData.getAccess(), cellSize, colorA, colorB);

			glTexSubImage3D(GL_TEXTURE_2D_ARRAY, ndx, x, y, z, w, h, d, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}
	}